

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QNetworkAuthenticationCredential>::begin(QList<QNetworkAuthenticationCredential> *this)

{
  QNetworkAuthenticationCredential *n;
  QArrayDataPointer<QNetworkAuthenticationCredential> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QNetworkAuthenticationCredential> *)0x185509);
  QArrayDataPointer<QNetworkAuthenticationCredential>::operator->(in_RDI);
  n = QArrayDataPointer<QNetworkAuthenticationCredential>::begin
                ((QArrayDataPointer<QNetworkAuthenticationCredential> *)0x18551a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }